

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::Shutdown_subproc(CSocekt *this)

{
  SourceFile file;
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  reference ppTVar4;
  CSocekt *in_RDI;
  iterator iter;
  ThreadItem *in_stack_ffffffffffffefa8;
  Logger *in_stack_ffffffffffffefb0;
  LogStream *in_stack_ffffffffffffefb8;
  __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
  in_stack_ffffffffffffefe0;
  __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
  local_1008 [5];
  Logger local_fe0;
  
  iVar2 = sem_post((sem_t *)&in_RDI->m_semEventSendQueue);
  if ((iVar2 == -1) && (LVar3 = muduo::Logger::logLevel(), (int)LVar3 < 3)) {
    muduo::Logger::SourceFile::SourceFile<100>
              ((SourceFile *)in_RDI,(char (*) [100])in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb0 = &local_fe0;
    file._8_8_ = in_RDI;
    file.data_ = (char *)in_stack_ffffffffffffefb8;
    muduo::Logger::Logger
              (in_stack_ffffffffffffefb0,file,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
    in_stack_ffffffffffffefb8 = muduo::Logger::stream(in_stack_ffffffffffffefb0);
    muduo::LogStream::operator<<((LogStream *)in_RDI,(char *)in_stack_ffffffffffffefb8);
    muduo::Logger::~Logger((Logger *)in_stack_ffffffffffffefe0._M_current);
  }
  __gnu_cxx::
  __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
  ::__normal_iterator(local_1008);
  local_1008[0]._M_current =
       (ThreadItem **)
       std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::begin
                 ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
                  in_stack_ffffffffffffefa8);
  while( true ) {
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::end
              ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
               in_stack_ffffffffffffefa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                        *)in_stack_ffffffffffffefb0,
                       (__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                        *)in_stack_ffffffffffffefa8);
    if (!bVar1) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
              ::operator*(local_1008);
    pthread_join((*ppTVar4)->_Handle,(void **)0x0);
    in_stack_ffffffffffffefe0 =
         __gnu_cxx::
         __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
         ::operator++((__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                       *)in_stack_ffffffffffffefb8,(int)((ulong)in_stack_ffffffffffffefb0 >> 0x20));
  }
  local_1008[0]._M_current =
       (ThreadItem **)
       std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::begin
                 ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
                  in_stack_ffffffffffffefa8);
  while( true ) {
    std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::end
              ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
               in_stack_ffffffffffffefa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                        *)in_stack_ffffffffffffefb0,
                       (__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                        *)in_stack_ffffffffffffefa8);
    if (!bVar1) break;
    ppTVar4 = __gnu_cxx::
              __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
              ::operator*(local_1008);
    if (*ppTVar4 != (ThreadItem *)0x0) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                ::operator*(local_1008);
      in_stack_ffffffffffffefa8 = *ppTVar4;
      if (in_stack_ffffffffffffefa8 != (ThreadItem *)0x0) {
        ThreadItem::~ThreadItem(in_stack_ffffffffffffefa8);
        operator_delete(in_stack_ffffffffffffefa8);
      }
    }
    __gnu_cxx::
    __normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
    ::operator++((__normal_iterator<CSocekt::ThreadItem_**,_std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>_>
                  *)in_stack_ffffffffffffefb8,(int)((ulong)in_stack_ffffffffffffefb0 >> 0x20));
  }
  std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::clear
            ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)0x13a7e5);
  clearMsgSendQueue(in_RDI);
  clearconnection(in_RDI);
  clearAllFromTimerQueue((CSocekt *)in_stack_ffffffffffffefe0._M_current);
  sem_destroy((sem_t *)&in_RDI->m_semEventSendQueue);
  return;
}

Assistant:

void CSocekt::Shutdown_subproc()
{
    //(1)把干活的线程停止掉，注意 系统应该尝试通过设置 g_stopEvent = 1来 开始让整个项目停止
    //(2)用到信号量的，可能还需要调用一下sem_post
    if(sem_post(&m_semEventSendQueue)==-1)  //让ServerSendQueueThread()流程走下来干活
    {
        LOG_INFO << "CSocekt::Shutdown_subproc()中sem_post(&m_semEventSendQueue)失败." ;
    }

    std::vector<ThreadItem*>::iterator iter;
	for(iter = m_threadVector.begin(); iter != m_threadVector.end(); iter++)
    {
        pthread_join((*iter)->_Handle, NULL); //等待一个线程终止
    }
    //(2)释放一下new出来的ThreadItem【线程池中的线程】    
	for(iter = m_threadVector.begin(); iter != m_threadVector.end(); iter++)
	{
		if(*iter)
			delete *iter;
	}
	m_threadVector.clear();

    //(3)队列相关
    clearMsgSendQueue();
    clearconnection();
    clearAllFromTimerQueue();
    
    //(4)多线程相关    
    sem_destroy(&m_semEventSendQueue);                  //发消息相关线程信号量释放
}